

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Bech32.cpp
# Opt level: O0

void __thiscall
Bech32Test_strip_unknown_chars_Test::TestBody(Bech32Test_strip_unknown_chars_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_1c0;
  Message local_1b8;
  allocator<char> local_1a9;
  string local_1a8;
  string local_188;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_3;
  Message local_150;
  allocator<char> local_141;
  string local_140;
  string local_120;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_2;
  Message local_e8;
  allocator<char> local_d9;
  string local_d8;
  string local_b8;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  Message local_80 [3];
  allocator<char> local_61;
  string local_60;
  string local_40;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  Bech32Test_strip_unknown_chars_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"tx1-rqqq-qqqq-qmhu-qk",&local_61);
  bech32::stripUnknownChars(&local_40,&local_60);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[18],_nullptr>
            ((EqHelper *)local_20,"bech32::stripUnknownChars(\"tx1-rqqq-qqqq-qmhu-qk\")",
             "\"tx1rqqqqqqqqmhuqk\"",&local_40,(char (*) [18])"tx1rqqqqqqqqmhuqk");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
               ,0x2f2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"TX1RJK0--U5bNG4JSb----FMC",&local_d9);
  bech32::stripUnknownChars(&local_b8,&local_d8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[18],_nullptr>
            ((EqHelper *)local_98,"bech32::stripUnknownChars(\"TX1RJK0--U5bNG4JSb----FMC\")",
             "\"TX1RJK0U5NG4JSFMC\"",&local_b8,(char (*) [18])"TX1RJK0U5NG4JSFMC");
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
               ,0x2f7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"tx1 rjk0 u5ng 4jsfmc",&local_141);
  bech32::stripUnknownChars(&local_120,&local_140);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[18],_nullptr>
            ((EqHelper *)local_100,"bech32::stripUnknownChars(\"tx1 rjk0 u5ng 4jsfmc\")",
             "\"tx1rjk0u5ng4jsfmc\"",&local_120,(char (*) [18])"tx1rjk0u5ng4jsfmc");
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
               ,0x2f8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"tx1!rjk0\\u5ng*4jsf^^mc",&local_1a9);
  bech32::stripUnknownChars(&local_188,&local_1a8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[18],_nullptr>
            ((EqHelper *)local_168,"bech32::stripUnknownChars(\"tx1!rjk0\\\\u5ng*4jsf^^mc\")",
             "\"tx1rjk0u5ng4jsfmc\"",&local_188,(char (*) [18])"tx1rjk0u5ng4jsfmc");
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp"
               ,0x2f9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  return;
}

Assistant:

TEST(Bech32Test, strip_unknown_chars) {
    EXPECT_EQ(bech32::stripUnknownChars("tx1-rqqq-qqqq-qmhu-qk"), "tx1rqqqqqqqqmhuqk");
    // TODO Not sure what to do about the extra '1' in the next test. We leave it in
    // because we leave in the separator character, but I think the test might be expected
    // to take it out. Not sure if it is a buggy test example from the spec or what.
    //EXPECT_EQ(bech32::stripUnknownChars("TX1R1JK0--U5bNG4JSb----FMC"), "TX1RJK0U5NG4JSFMC");
    EXPECT_EQ(bech32::stripUnknownChars("TX1RJK0--U5bNG4JSb----FMC"), "TX1RJK0U5NG4JSFMC");
    EXPECT_EQ(bech32::stripUnknownChars("tx1 rjk0 u5ng 4jsfmc"), "tx1rjk0u5ng4jsfmc");
    EXPECT_EQ(bech32::stripUnknownChars("tx1!rjk0\\u5ng*4jsf^^mc"), "tx1rjk0u5ng4jsfmc");
}